

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O3

void __thiscall UKF::UpdateRadar(UKF *this,MeasurementPackage *meas_package)

{
  VectorXd *this_00;
  DenseIndex size_00;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  Index index;
  undefined8 *puVar7;
  DenseStorage<double,__1,__1,__1,_0> *pDVar8;
  long lVar9;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar10;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  Index index_2;
  DenseStorage<double,__1,__1,__1,_0> *pDVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  DenseStorage<double,__1,__1,__1,_0> *pDVar15;
  Index size;
  long lVar16;
  bool bVar17;
  double dVar18;
  MatrixXd Zsig;
  MatrixXd S;
  VectorXd z;
  MatrixXd Tc;
  MatrixXd K;
  VectorXd x_diff;
  VectorXd z_diff;
  MatrixXd R;
  ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_1a0;
  undefined1 local_168 [24];
  DenseStorage<double,__1,__1,__1,_0> *pDStack_150;
  long local_148;
  DenseStorage<double,__1,__1,__1,_0> local_138;
  undefined1 local_120 [16];
  GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>
  local_110;
  DenseStorage<double,__1,__1,__1,_0> local_e8;
  DenseStorage<double,__1,__1,__1,_0> local_d0;
  double local_b8;
  DenseStorage<double,__1,__1,__1,_0> local_b0;
  undefined1 local_98 [24];
  DenseStorage<double,__1,__1,__1,_0> *pDStack_80;
  DenseStorage<double,__1,__1,__1,_0> *local_78;
  double local_70;
  double local_68;
  plain_array<double,_1,_0,_0> local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  Scalar local_38;
  
  size_00 = (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)local_120,size_00,size_00,1);
  pDVar15 = (DenseStorage<double,__1,__1,__1,_0> *)
            (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if ((long)pDVar15 < 0) {
LAB_00107891:
    pcVar14 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_001078a6;
  }
  if ((DenseStorage<double,__1,__1,__1,_0> *)local_120._8_8_ != pDVar15) {
    free((void *)local_120._0_8_);
    if (pDVar15 == (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
      local_120._0_8_ = (double *)0x0;
    }
    else if (((ulong)pDVar15 >> 0x3d != 0) ||
            (local_120._0_8_ = malloc((long)pDVar15 * 8), (double *)local_120._0_8_ == (double *)0x0
            )) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = operator_delete;
      __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_120._8_8_ = pDVar15;
    if (pDVar15 !=
        (DenseStorage<double,__1,__1,__1,_0> *)
        (meas_package->raw_measurements_).
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      pcVar14 = 
      "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_00107a24;
    }
  }
  pDVar8 = (DenseStorage<double,__1,__1,__1,_0> *)((ulong)pDVar15 & 0x7ffffffffffffffe);
  if ((DenseStorage<double,__1,__1,__1,_0> *)0x1 < pDVar15) {
    pDVar11 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
    do {
      pdVar1 = (meas_package->raw_measurements_).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               (long)pDVar11;
      dVar18 = pdVar1[1];
      *(double *)(local_120._0_8_ + pDVar11 * 8) = *pdVar1;
      ((double *)(local_120._0_8_ + pDVar11 * 8))[1] = dVar18;
      pDVar11 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar11->m_data + 2);
    } while (pDVar11 < pDVar8);
  }
  if ((long)pDVar8 < (long)pDVar15) {
    pdVar1 = (meas_package->raw_measurements_).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    do {
      *(double *)(local_120._0_8_ + pDVar8 * 8) = pdVar1[(long)pDVar8];
      pDVar8 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar8->m_data + 1);
    } while (pDVar15 != pDVar8);
  }
  local_168._16_8_ = (void *)0x0;
  pDStack_150 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
  local_148 = 0;
  if (this->n_aug_ < 0) {
LAB_001078cf:
    pcVar14 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
    ;
LAB_001078a6:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,pcVar14);
  }
  lVar16 = (ulong)(uint)this->n_aug_ * 2 + 1;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)(local_168 + 0x10),lVar16 * 3,3,lVar16);
  if (-1 < this->n_aug_) {
    lVar16 = -1;
    do {
      uVar12 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      if (((((long)uVar12 < 1) ||
           (lVar16 = lVar16 + 1,
           (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols <= lVar16)) || (uVar12 < 2)) || ((uVar12 == 2 || (uVar12 < 4)))) {
LAB_001077e7:
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x151,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      pdVar1 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      lVar9 = uVar12 * lVar16;
      local_68 = pdVar1[lVar9];
      local_70 = pdVar1[lVar9 + 1];
      local_48 = pdVar1[lVar9 + 2];
      local_b8 = pdVar1[lVar9 + 3];
      local_50 = cos(local_b8);
      local_b8 = sin(local_b8);
      if (((long)pDStack_150 < 1) || (local_148 <= lVar16)) goto LAB_001077e7;
      local_58 = SQRT(local_68 * local_68 + local_70 * local_70);
      *(double *)(local_168._16_8_ + (long)pDStack_150 * lVar16 * 8) = local_58;
      dVar18 = atan2(local_70,local_68);
      if (((long)pDStack_150 < 2) || (local_148 <= lVar16)) goto LAB_001077e7;
      *(double *)(local_168._16_8_ + ((long)pDStack_150 * lVar16 + 1) * 8) = dVar18;
      if ((pDStack_150 < (DenseStorage<double,__1,__1,__1,_0> *)0x3) || (local_148 <= lVar16))
      goto LAB_001077e7;
      *(double *)(local_168._16_8_ + ((long)pDStack_150 * lVar16 + 2) * 8) =
           (local_68 * local_50 * local_48 + local_70 * local_b8 * local_48) / local_58;
    } while (SBORROW8(lVar16,(long)this->n_aug_ * 2) != lVar16 + (long)this->n_aug_ * -2 < 0);
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)local_168,3,3,1);
  if ((long)local_168._8_8_ < 0) {
    pcVar14 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_00107984;
  }
  if ((DenseStorage<double,__1,__1,__1,_0> *)0x1 < (ulong)local_168._8_8_) {
    uVar12 = 0;
    do {
      *(double *)(local_168._0_8_ + uVar12 * 8) = 0.0;
      ((double *)(local_168._0_8_ + uVar12 * 8))[1] = 0.0;
      uVar12 = uVar12 + 2;
    } while (uVar12 < (local_168._8_8_ & 0x7ffffffffffffffe));
  }
  if ((long)(local_168._8_8_ & 0x7ffffffffffffffe) < (long)local_168._8_8_) {
    memset((void *)((local_168._8_8_ << 3 & 0xfffffffffffffff0) + local_168._0_8_),0,
           (ulong)((uint)(local_168._8_8_ << 3) & 8));
  }
  if (-1 < this->n_aug_) {
    lVar9 = 0;
    lVar16 = 0;
    do {
      if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= lVar16) goto LAB_00107806;
      if (((long)pDStack_150 < 0) &&
         ((void *)(local_168._16_8_ + (long)pDStack_150 * lVar16 * 8) != (void *)0x0))
      goto LAB_00107844;
      if (local_148 <= lVar16) goto LAB_00107825;
      if ((DenseStorage<double,__1,__1,__1,_0> *)local_168._8_8_ != pDStack_150) {
        pcVar14 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
        ;
        goto LAB_001078c5;
      }
      if ((long)pDStack_150 < 0) goto LAB_00107891;
      dVar18 = (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data[lVar16];
      local_168._8_8_ = pDStack_150;
      pDVar15 = (DenseStorage<double,__1,__1,__1,_0> *)((ulong)pDStack_150 & 0x7ffffffffffffffe);
      if ((DenseStorage<double,__1,__1,__1,_0> *)0x1 < pDStack_150) {
        pDVar8 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
        do {
          dVar5 = ((double *)(local_168._0_8_ + pDVar8 * 8))[1];
          pdVar1 = (double *)(local_168._16_8_ + (long)pDVar8 * 8 + (long)pDStack_150 * lVar9);
          dVar6 = pdVar1[1];
          *(double *)(local_168._0_8_ + pDVar8 * 8) =
               *pdVar1 * dVar18 + *(double *)(local_168._0_8_ + pDVar8 * 8);
          ((double *)(local_168._0_8_ + pDVar8 * 8))[1] = dVar6 * dVar18 + dVar5;
          pDVar8 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar8->m_data + 2);
        } while (pDVar8 < pDVar15);
      }
      if ((long)pDVar15 < (long)pDStack_150) {
        do {
          *(double *)(local_168._0_8_ + pDVar15 * 8) =
               *(double *)(local_168._16_8_ + (long)pDVar15 * 8 + (long)pDStack_150 * lVar9) *
               dVar18 + *(double *)(local_168._0_8_ + pDVar15 * 8);
          pDVar15 = (DenseStorage<double,__1,__1,__1,_0> *)((long)&pDVar15->m_data + 1);
        } while (pDStack_150 != pDVar15);
      }
      lVar9 = lVar9 + 8;
      bVar17 = SBORROW8(lVar16,(long)this->n_aug_ * 2);
      lVar4 = lVar16 + (long)this->n_aug_ * -2;
      lVar16 = lVar16 + 1;
    } while (bVar17 != lVar4 < 0);
  }
  local_138.m_data = (double *)0x0;
  local_138.m_rows = 0;
  local_138.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_138,9,3,3);
  local_1a0.m_lhs = (LhsNested)local_138.m_rows;
  local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)local_138.m_cols;
  local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  if (-1 < (local_138.m_cols | local_138.m_rows)) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_138,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_1a0);
    if (-1 < this->n_aug_) {
      pDVar15 = (DenseStorage<double,__1,__1,__1,_0> *)(local_98 + 0x10);
      lVar16 = 0;
      do {
        pDVar8 = (DenseStorage<double,__1,__1,__1,_0> *)
                 (local_168._16_8_ + (long)pDStack_150 * lVar16 * 8);
        if ((long)pDStack_150 < 0 && pDVar8 != (DenseStorage<double,__1,__1,__1,_0> *)0x0)
        goto LAB_00107844;
        if (local_148 <= lVar16) goto LAB_00107825;
        local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_data = (double *)pDStack_150;
        local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols = (DenseIndex)(local_168 + 0x10);
        local_1a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_data = (double *)pDStack_150;
        local_1a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_rows = (DenseIndex)local_168;
        local_1a0.m_lhs = (LhsNested)pDVar8;
        if (pDStack_150 != (DenseStorage<double,__1,__1,__1,_0> *)local_168._8_8_)
        goto LAB_0010787a;
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                  ((Matrix<double,_1,1,0,_1,1> *)pDVar15,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_1a0);
        if ((long)pDStack_80 < 2) goto LAB_00107806;
        dVar18 = *(double *)(local_98._16_8_ + 8);
        if (3.141592653589793 < dVar18) {
          do {
            dVar18 = dVar18 + -6.283185307179586;
          } while (3.141592653589793 < dVar18);
          *(double *)(local_98._16_8_ + 8) = dVar18;
        }
        if (dVar18 < -3.141592653589793) {
          do {
            dVar18 = dVar18 + 6.283185307179586;
          } while (dVar18 < -3.141592653589793);
          *(double *)(local_98._16_8_ + 8) = dVar18;
        }
        if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= lVar16) goto LAB_00107806;
        local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_data = (double *)
                 (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[lVar16];
        local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols = 0;
        local_1a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_data = (double *)0x0;
        local_1a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_rows = 0;
        local_110.
        super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_lhs = (LhsNested)&local_138;
        local_1a0.m_lhs = (LhsNested)pDVar15;
        local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_rows = (DenseIndex)pDVar15;
        local_110.
        super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_rhs = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_1a0);
        if (((DenseStorage<double,__1,__1,__1,_0> *)local_138.m_rows !=
             *(DenseStorage<double,__1,__1,__1,_0> **)((long)local_1a0.m_lhs + 8)) ||
           ((DenseStorage<double,__1,__1,__1,_0> *)local_138.m_cols !=
            *(DenseStorage<double,__1,__1,__1,_0> **)
             (local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows + 8))) goto LAB_00107863;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_138,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                    *)&local_110);
        free((void *)local_1a0.m_rhs.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols);
        free((void *)local_98._16_8_);
        bVar17 = SBORROW8(lVar16,(long)this->n_aug_ * 2);
        lVar9 = lVar16 + (long)this->n_aug_ * -2;
        lVar16 = lVar16 + 1;
      } while (bVar17 != lVar9 < 0);
    }
    pDVar15 = (DenseStorage<double,__1,__1,__1,_0> *)(local_98 + 0x10);
    local_98._16_8_ = (double *)0x0;
    pDStack_80 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
    local_78 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(pDVar15,9,3,3);
    local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)0x0;
    local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = 1;
    local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = 1;
    *(double *)local_98._16_8_ = this->std_radr_ * this->std_radr_;
    local_110.
    super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
    .m_lhs = (LhsNested)0x0;
    local_1a0.m_lhs = (LhsNested)pDVar15;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_1a0,
                         (Scalar *)&local_110);
    local_e8.m_data = (double *)0x0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,(Scalar *)&local_e8);
    local_d0.m_data = (double *)0x0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,(Scalar *)&local_d0);
    local_b0.m_data = (double *)(this->std_radphi_ * this->std_radphi_);
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,(Scalar *)&local_b0);
    local_98._0_8_ = (double *)0x0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,(Scalar *)local_98);
    local_60.array[0] = (double  [1])0.0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,local_60.array);
    local_38 = 0.0;
    pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar10,&local_38);
    local_40 = this->std_radrd_ * this->std_radrd_;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar10,&local_40)
    ;
    pDVar8 = *(DenseStorage<double,__1,__1,__1,_0> **)((long)local_1a0.m_lhs + 0x10);
    if ((undefined1 *)
        ((long)local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data +
        (long)(PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols) != *(undefined1 **)((long)local_1a0.m_lhs + 8)) {
      if (pDVar8 != (DenseStorage<double,__1,__1,__1,_0> *)0x0) goto LAB_00107950;
      pDVar8 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
    }
    if ((DenseStorage<double,__1,__1,__1,_0> *)
        local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_rows != pDVar8) {
LAB_00107950:
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CommaInitializer.h"
                    ,0x6f,
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    local_1a0.m_lhs = (LhsNested)&local_138;
    local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)pDVar15;
    if (((DenseStorage<double,__1,__1,__1,_0> *)local_138.m_rows != pDStack_80) ||
       ((DenseStorage<double,__1,__1,__1,_0> *)local_138.m_cols != local_78)) {
      pcVar14 = 
      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
      ;
      goto LAB_001078c5;
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_138,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_1a0);
    local_e8.m_data = (double *)0x0;
    local_e8.m_rows = 0;
    local_e8.m_cols = 0;
    lVar16 = (long)this->n_x_;
    if (lVar16 < 0) goto LAB_001078cf;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_e8,lVar16 * 3,lVar16,3);
    local_1a0.m_lhs = (LhsNested)local_e8.m_rows;
    local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_e8.m_cols;
    local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = 0;
    if (-1 < (local_e8.m_cols | local_e8.m_rows)) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_e8,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_1a0);
      if (-1 < this->n_aug_) {
        lVar16 = 0;
        do {
          pDVar15 = (DenseStorage<double,__1,__1,__1,_0> *)
                    (local_168._16_8_ + (long)pDStack_150 * lVar16 * 8);
          if ((long)pDStack_150 < 0 && pDVar15 != (DenseStorage<double,__1,__1,__1,_0> *)0x0) {
LAB_00107844:
            __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/MapBase.h"
                          ,0x94,
                          "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                         );
          }
          if (local_148 <= lVar16) {
LAB_00107825:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Block.h"
                          ,0x76,
                          "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                         );
          }
          local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_data = (double *)pDStack_150;
          local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols = (DenseIndex)(local_168 + 0x10);
          local_1a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_data = (double *)pDStack_150;
          local_1a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows = (DenseIndex)local_168;
          local_1a0.m_lhs = (LhsNested)pDVar15;
          if (pDStack_150 != (DenseStorage<double,__1,__1,__1,_0> *)local_168._8_8_)
          goto LAB_0010787a;
          Eigen::Matrix<double,-1,1,0,-1,1>::
          Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                    ((Matrix<double,_1,1,0,_1,1> *)&local_d0,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&local_1a0);
          if (local_d0.m_rows < 2) goto LAB_00107806;
          dVar18 = local_d0.m_data[1];
          if (3.141592653589793 < dVar18) {
            do {
              dVar18 = dVar18 + -6.283185307179586;
            } while (3.141592653589793 < dVar18);
            local_d0.m_data[1] = dVar18;
          }
          if (dVar18 < -3.141592653589793) {
            do {
              dVar18 = dVar18 + 6.283185307179586;
            } while (dVar18 < -3.141592653589793);
            local_d0.m_data[1] = dVar18;
          }
          pDVar15 = (DenseStorage<double,__1,__1,__1,_0> *)
                    (this->Xsig_pred_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_rows;
          pDVar8 = (DenseStorage<double,__1,__1,__1,_0> *)
                   ((this->Xsig_pred_).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_data + (long)pDVar15 * lVar16);
          if ((long)pDVar15 < 0 && pDVar8 != (DenseStorage<double,__1,__1,__1,_0> *)0x0)
          goto LAB_00107844;
          if ((this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols <= lVar16) goto LAB_00107825;
          local_1a0.m_lhs = (LhsNested)pDVar8;
          local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols = (DenseIndex)&this->Xsig_pred_;
          local_1a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_data = (double *)pDVar15;
          local_1a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows = (DenseIndex)&this->x_;
          if (pDVar15 !=
              (DenseStorage<double,__1,__1,__1,_0> *)
              (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows) goto LAB_0010787a;
          local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_data = (double *)pDVar15;
          Eigen::Matrix<double,-1,1,0,-1,1>::
          Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                    ((Matrix<double,_1,1,0,_1,1> *)&local_b0,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)&local_1a0);
          if (local_b0.m_rows < 4) goto LAB_00107806;
          dVar18 = *(double *)((long)local_b0.m_data + 0x18);
          if (3.141592653589793 < dVar18) {
            do {
              dVar18 = dVar18 + -6.283185307179586;
            } while (3.141592653589793 < dVar18);
            *(double *)((long)local_b0.m_data + 0x18) = dVar18;
          }
          if (dVar18 < -3.141592653589793) {
            do {
              dVar18 = dVar18 + 6.283185307179586;
            } while (dVar18 < -3.141592653589793);
            *(double *)((long)local_b0.m_data + 0x18) = dVar18;
          }
          if ((this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows <= lVar16) goto LAB_00107806;
          local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_data = (double *)
                    (this->weights_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data[lVar16];
          local_1a0.m_lhs = (LhsNested)&local_b0;
          local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_rows = (DenseIndex)&local_d0;
          local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
          .m_cols = 0;
          local_1a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_data = (double *)0x0;
          local_1a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows = 0;
          local_110.
          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          .m_lhs = (LhsNested)&local_e8;
          local_110.
          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          .m_rhs = Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_1a0);
          if (((DenseStorage<double,__1,__1,__1,_0> *)local_e8.m_rows !=
               *(DenseStorage<double,__1,__1,__1,_0> **)((long)local_1a0.m_lhs + 8)) ||
             ((DenseStorage<double,__1,__1,__1,_0> *)local_e8.m_cols !=
              *(DenseStorage<double,__1,__1,__1,_0> **)
               (local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows + 8))) goto LAB_00107863;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,2>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_e8,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_2>_>_>
                      *)&local_110);
          free((void *)local_1a0.m_rhs.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols);
          free(local_b0.m_data);
          free(local_d0.m_data);
          bVar17 = SBORROW8(lVar16,(long)this->n_aug_ * 2);
          lVar9 = lVar16 + (long)this->n_aug_ * -2;
          lVar16 = lVar16 + 1;
        } while (bVar17 != lVar9 < 0);
      }
      if (local_138.m_rows != local_138.m_cols) {
LAB_00107917:
        __assert_fail("rows() == cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/LU/Inverse.h"
                      ,0x143,
                      "const internal::inverse_impl<Derived> Eigen::MatrixBase<Eigen::Matrix<double, -1, -1>>::inverse() const [Derived = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      local_110.
      super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      .m_lhs = (LhsNested)&local_138;
      Eigen::
      ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_5>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
      ::ProductBase(&local_1a0,(Matrix<double,__1,__1,_0,__1,__1> *)&local_e8,
                    (ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     *)&local_110);
      other = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_1a0);
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                (&local_d0,*(long *)(other + 0x10) * *(long *)(other + 8),*(long *)(other + 8),
                 *(long *)(other + 0x10));
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_d0,other);
      free(local_1a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      free(local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = (double *)local_168;
      local_1a0.m_lhs = (LhsNested)local_120;
      if (local_120._8_8_ == local_168._8_8_) {
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                  ((Matrix<double,_1,1,0,_1,1> *)local_98,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&local_1a0);
        if ((long)local_98._8_8_ < 2) {
LAB_00107806:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x18a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        dVar18 = *(double *)(local_98._0_8_ + 8);
        if (3.141592653589793 < dVar18) {
          do {
            dVar18 = dVar18 + -6.283185307179586;
          } while (3.141592653589793 < dVar18);
          *(double *)(local_98._0_8_ + 8) = dVar18;
        }
        if (dVar18 < -3.141592653589793) {
          do {
            dVar18 = dVar18 + 6.283185307179586;
          } while (dVar18 < -3.141592653589793);
          *(double *)(local_98._0_8_ + 8) = dVar18;
        }
        local_b0.m_data = (double *)local_98;
        if (local_138.m_rows != local_138.m_cols) goto LAB_00107917;
        local_60.array[0] = (double  [1])(double  [1])&local_138;
        Eigen::
        ProductBase<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_4>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
        ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>,_Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                       *)&local_1a0,(Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_b0,
                      (ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       *)&local_60);
        Eigen::
        GeneralProduct<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_4>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>
        ::GeneralProduct((GeneralProduct<Eigen::GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3>
                          *)&local_110,
                         (GeneralProduct<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_4>
                          *)&local_1a0,(Matrix<double,__1,_1,_0,__1,_1> *)local_98);
        this->NIS_radar_ =
             (double)local_110.
                     super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                     .m_lhs;
        free(local_1a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data);
        free(local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data);
        local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_rows = 0;
        local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols = 0;
        local_1a0.m_lhs = (LhsNested)&local_d0;
        local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_data = (double *)local_98;
        if (local_d0.m_cols != local_98._8_8_) {
          pcVar14 = 
          "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>]"
          ;
LAB_00107a05:
          __assert_fail("a_lhs.cols() == a_rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/ProductBase.h"
                        ,0x66,pcVar14);
        }
        this_00 = &this->x_;
        local_110.
        super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_lhs = (LhsNested)this_00;
        local_110.
        super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_rhs = (RhsNested)Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_1a0);
        if ((this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows == *(DenseIndex *)((long)local_1a0.m_lhs + 8)) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
          resizeLike<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this_00,
                     (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>_>_>
                      *)&local_110);
          uVar12 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_rows;
          if (uVar12 != *(DenseIndex *)
                         ((long)local_110.
                                super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                .m_rhs + 8)) {
            pcVar14 = 
            "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>>]"
            ;
LAB_00107a24:
            __assert_fail("rows() == other.rows() && cols() == other.cols()",
                          "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/Assign.h"
                          ,0x1f9,pcVar14);
          }
          uVar13 = uVar12 - ((long)uVar12 >> 0x3f) & 0xfffffffffffffffe;
          if (1 < (long)uVar12) {
            lVar16 = 0;
            do {
              dVar5 = (*(double **)
                        &(local_110.
                          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                         .m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> +
                      lVar16)[1];
              dVar18 = (*(double **)
                         &(local_110.
                           super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       + lVar16)[1];
              pdVar1 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data + lVar16;
              *pdVar1 = (*(double **)
                          &(local_110.
                            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        )[lVar16] +
                        (*(double **)
                          &(local_110.
                            super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           .m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        )[lVar16];
              pdVar1[1] = dVar5 + dVar18;
              lVar16 = lVar16 + 2;
            } while (lVar16 < (long)uVar13);
          }
          if ((long)uVar13 < (long)uVar12) {
            pdVar1 = *(double **)
                      &(local_110.
                        super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_lhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
            pdVar2 = *(double **)
                      &(local_110.
                        super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_rhs)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>;
            pdVar3 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
            do {
              pdVar3[uVar13] = pdVar1[uVar13] + pdVar2[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar12 != uVar13);
          }
          free((void *)local_1a0.m_rhs.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_rows);
          local_110.
          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data = (double *)0x0;
          local_110.
          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows = 0;
          local_110.
          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols = 0;
          local_110.
          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          .m_lhs = (LhsNested)&local_d0;
          local_110.
          super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
          .m_rhs = (RhsNested)&local_138;
          if (local_d0.m_cols != local_138.m_rows) {
            pcVar14 = 
            "Eigen::ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::ProductBase(const Lhs &, const Rhs &) [Derived = Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>]"
            ;
            goto LAB_00107a05;
          }
          local_60.array[0] = (double  [1])(double  [1])&local_d0;
          Eigen::
          ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::ProductBase((ProductBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>,_Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         *)&local_1a0,&local_110,
                        (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_60);
          local_b0.m_data = (double *)&this->P_;
          local_b0.m_rows =
               (DenseIndex)Eigen::ProductBase::operator_cast_to_Matrix_((ProductBase *)&local_1a0);
          if (((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_rows == *(DenseIndex *)((long)local_1a0.m_lhs + 8)) &&
             ((this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols == *(DenseIndex *)
                         ((long)local_1a0.m_rhs.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_data + 8))) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            lazyAssign<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,5>const>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&this->P_,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_5>_>_>
                        *)&local_b0);
            free((void *)local_1a0.m_rhs.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_rows);
            free(local_110.
                 super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 .m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data);
            free((void *)local_98._0_8_);
            free(local_d0.m_data);
            free(local_e8.m_data);
            free((void *)local_98._16_8_);
            free(local_138.m_data);
            free((void *)local_168._0_8_);
            free((void *)local_168._16_8_);
            free((void *)local_120._0_8_);
            return;
          }
          pcVar14 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 5>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>, 5>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 5>]"
          ;
        }
        else {
          pcVar14 = 
          "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::GeneralProduct<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>, 4>]"
          ;
        }
      }
      else {
        pcVar14 = 
        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
        ;
      }
      goto LAB_001078c5;
    }
  }
  local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  pcVar14 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
  ;
LAB_00107984:
  __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CwiseNullaryOp.h"
                ,0x3f,pcVar14);
LAB_0010787a:
  pcVar14 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Rhs = const Eigen::Matrix<double, -1, 1>]"
  ;
  local_1a0.m_rhs.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = local_1a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_data;
  goto LAB_001078c5;
LAB_00107863:
  pcVar14 = 
  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, -1>, const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, -1>, Rhs = const Eigen::GeneralProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Matrix<double, -1, 1>>, Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, 2>]"
  ;
LAB_001078c5:
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Unscented-Kalman-Filter-Project/src/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x84,pcVar14);
}

Assistant:

void UKF::UpdateRadar(MeasurementPackage meas_package) {
  /**
  TODO:

  Complete this function! Use radar data to update the belief about the object's
  position. Modify the state vector, x_, and covariance, P_.

  You'll also need to calculate the radar NIS.
  */

  //extract measurement as VectorXd
  VectorXd z = meas_package.raw_measurements_;

  //set measurement dimension, radar can measure r, phi, and r_dot
  int n_z = 3;

  //create matrix for sigma points in measurement space
  MatrixXd Zsig = MatrixXd(n_z, 2 * n_aug_ + 1);

  //transform sigma points into measurement space
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //2n+1 simga points

    // extract values for better readibility
    double p_x = Xsig_pred_(0, i);
    double p_y = Xsig_pred_(1, i);
    double v   = Xsig_pred_(2, i);
    double yaw = Xsig_pred_(3, i);

    double v1 = cos(yaw)*v;
    double v2 = sin(yaw)*v;

    // measurement model
    Zsig(0, i) = sqrt(p_x*p_x + p_y*p_y);                        //r
    Zsig(1, i) = atan2(p_y, p_x);                                 //phi
    Zsig(2, i) = (p_x*v1 + p_y*v2) / sqrt(p_x*p_x + p_y*p_y);   //r_dot
  }

  //mean predicted measurement
  VectorXd z_pred = VectorXd(n_z);
  z_pred.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {
    z_pred = z_pred + weights_(i) * Zsig.col(i);
  }

  //measurement covariance matrix S
  MatrixXd S = MatrixXd(n_z, n_z);
  S.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //2n+1 simga points
    //residual
    VectorXd z_diff = Zsig.col(i) - z_pred;

    //angle normalization
    while (z_diff(1)> M_PI) z_diff(1) -= 2.*M_PI;
    while (z_diff(1)<-M_PI) z_diff(1) += 2.*M_PI;

    S = S + weights_(i) * z_diff * z_diff.transpose();
  }

  //add measurement noise covariance matrix
  MatrixXd R = MatrixXd(n_z, n_z);
  R << std_radr_*std_radr_,                       0,                     0,
                         0, std_radphi_*std_radphi_,                     0,
                         0,                       0, std_radrd_*std_radrd_;
  S = S + R;

  //create matrix for cross correlation Tc
  MatrixXd Tc = MatrixXd(n_x_, n_z);

  /*****************************************************************************
  *  UKF Update for Radar
  ****************************************************************************/
  //calculate cross correlation matrix
  Tc.fill(0.0);
  for (int i = 0; i < 2 * n_aug_ + 1; i++) {  //2n+1 simga points

    //residual
    VectorXd z_diff = Zsig.col(i) - z_pred;
    //angle normalization
    while (z_diff(1)> M_PI) z_diff(1) -= 2.*M_PI;
    while (z_diff(1)<-M_PI) z_diff(1) += 2.*M_PI;

    // state difference
    VectorXd x_diff = Xsig_pred_.col(i) - x_;
    //angle normalization
    while (x_diff(3)> M_PI) x_diff(3) -= 2.*M_PI;
    while (x_diff(3)<-M_PI) x_diff(3) += 2.*M_PI;

    Tc = Tc + weights_(i) * x_diff * z_diff.transpose();
  }

  //Kalman gain K;
  MatrixXd K = Tc * S.inverse();

  //residual
  VectorXd z_diff = z - z_pred;

  //angle normalization
  while (z_diff(1)> M_PI) z_diff(1) -= 2.*M_PI;
  while (z_diff(1)<-M_PI) z_diff(1) += 2.*M_PI;

  //calculate NIS
  NIS_radar_ = z_diff.transpose() * S.inverse() * z_diff;

  //update state mean and covariance matrix
  x_ = x_ + K * z_diff;
  P_ = P_ - K*S*K.transpose();

}